

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::extractClassName(string *classOrQualifiedMethodName)

{
  char *pcVar1;
  string *in_RSI;
  string *in_RDI;
  size_t penultimateColons;
  size_t lastColons;
  string *className;
  string local_58 [32];
  long local_38;
  undefined8 local_30;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI,in_RSI);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
  if (*pcVar1 == '&') {
    local_30 = std::__cxx11::string::rfind((char *)in_RDI,0x1f677c);
    local_38 = std::__cxx11::string::rfind((char *)in_RDI,0x1f677c);
    if (local_38 == -1) {
      local_38 = 1;
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_58);
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

inline std::string extractClassName( std::string const& classOrQualifiedMethodName ) {
        std::string className = classOrQualifiedMethodName;
        if( className[0] == '&' )
        {
            std::size_t lastColons = className.rfind( "::" );
            std::size_t penultimateColons = className.rfind( "::", lastColons-1 );
            if( penultimateColons == std::string::npos )
                penultimateColons = 1;
            className = className.substr( penultimateColons, lastColons-penultimateColons );
        }
        return className;
    }